

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createBoxShape(btCollisionWorldImporter *this,btVector3 *halfExtents)

{
  btCollisionShape *this_00;
  btCollisionShape *local_20;
  
  this_00 = (btCollisionShape *)btBoxShape::operator_new(0x50);
  btBoxShape::btBoxShape((btBoxShape *)this_00,halfExtents);
  local_20 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back(&this->m_allocatedCollisionShapes,&local_20);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createBoxShape(const btVector3& halfExtents)
{
	btBoxShape* shape = new btBoxShape(halfExtents);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}